

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall google::protobuf::io::Printer::WriteRaw(Printer *this,char *data,size_t size)

{
  pointer pbVar1;
  pointer puVar2;
  pointer puVar3;
  unsigned_long uVar4;
  string *var;
  pointer k;
  size_t sVar5;
  char c;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
  local_48;
  
  if (size != 0) {
    if (this->failed_ == false) {
      if ((this->at_start_of_line_ == true) && (*data != '\n')) {
        IndentIfAtStart(this);
        if (this->failed_ != false) {
          return;
        }
        k = (this->line_start_variables_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (this->line_start_variables_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (k != pbVar1) {
          do {
            absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
            ::try_emplace_impl<std::__cxx11::string_const&>(&local_48,&this->substitutions_,k);
            sVar5 = this->indent_;
            *(long *)((long)local_48.first.field_1.slot_ + 0x20) =
                 *(long *)((long)local_48.first.field_1.slot_ + 0x20) + sVar5;
            *(long *)((long)local_48.first.field_1.slot_ + 0x28) =
                 *(long *)((long)local_48.first.field_1.slot_ + 0x28) + sVar5;
            k = k + 1;
          } while (k != pbVar1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&this->line_start_variables_,
                        (this->line_start_variables_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      if ((this->paren_depth_to_omit_).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->paren_depth_to_omit_).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,data,size);
      }
      else if (size != 0) {
        sVar5 = 0;
        do {
          local_48.first.ctrl_._0_1_ = data[sVar5];
          if ((char)local_48.first.ctrl_ == ')') {
            puVar2 = (this->paren_depth_to_omit_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (((this->paren_depth_to_omit_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start == puVar2) ||
               (uVar4 = this->paren_depth_, puVar2[-1] != uVar4)) {
              this->paren_depth_ = this->paren_depth_ - 1;
              goto LAB_00462d34;
            }
            (this->paren_depth_to_omit_).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar2 + -1;
            this->paren_depth_ = uVar4 - 1;
          }
          else {
            if ((char)local_48.first.ctrl_ == '(') {
              puVar2 = (this->paren_depth_to_omit_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar4 = this->paren_depth_ + 1;
              this->paren_depth_ = uVar4;
              puVar3 = (this->paren_depth_to_omit_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if ((puVar2 != puVar3) && (puVar3[-1] == uVar4)) goto LAB_00462d44;
            }
LAB_00462d34:
            zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,(char *)&local_48,1);
          }
LAB_00462d44:
          sVar5 = sVar5 + 1;
        } while (size != sVar5);
      }
      this->failed_ = (bool)(this->failed_ | (this->sink_).failed_);
    }
  }
  return;
}

Assistant:

void Printer::WriteRaw(const char* data, size_t size) {
  if (failed_ || size == 0) {
    return;
  }

  if (at_start_of_line_ && data[0] != '\n') {
    IndentIfAtStart();
    if (failed_) {
      return;
    }

    // Fix up empty variables (e.g., "{") that should be annotated as
    // coming after the indent.
    for (const std::string& var : line_start_variables_) {
      auto& pair = substitutions_[var];
      pair.first += indent_;
      pair.second += indent_;
    }
  }

  // If we're going to write any data, clear line_start_variables_, since
  // we've either updated them in the block above or they no longer refer to
  // the current line.
  line_start_variables_.clear();

  if (paren_depth_to_omit_.empty()) {
    sink_.Append(data, size);
  } else {
    for (size_t i = 0; i < size; ++i) {
      char c = data[i];
      switch (c) {
        case '(':
          paren_depth_++;
          if (!paren_depth_to_omit_.empty() &&
              paren_depth_to_omit_.back() == paren_depth_) {
            break;
          }

          sink_.Append(&c, 1);
          break;
        case ')':
          if (!paren_depth_to_omit_.empty() &&
              paren_depth_to_omit_.back() == paren_depth_) {
            paren_depth_to_omit_.pop_back();
            paren_depth_--;
            break;
          }

          paren_depth_--;
          sink_.Append(&c, 1);
          break;
        default:
          sink_.Append(&c, 1);
          break;
      }
    }
  }
  failed_ |= sink_.failed();
}